

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O2

Window anon_unknown.dwarf_e28c5::getParentWindow(Display *disp,Window win)

{
  Window parent;
  uint numChildren;
  Window *children;
  Window root;
  Window local_28;
  undefined1 local_1c [4];
  long local_18;
  undefined1 local_10 [8];
  
  local_18 = 0;
  XQueryTree(disp,win,local_10,&local_28,&local_18,local_1c);
  if (local_18 != 0) {
    XFree();
  }
  return local_28;
}

Assistant:

::Window getParentWindow(::Display* disp, ::Window win)
    {
        ::Window root, parent;
        ::Window* children = NULL;
        unsigned int numChildren;

        XQueryTree(disp, win, &root, &parent, &children, &numChildren);

        // Children information is not used, so must be freed.
        if (children != NULL)
            XFree(children);

        return parent;
    }